

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

void __thiscall
pybind11::detail::error_fetch_and_normalize::error_fetch_and_normalize
          (error_fetch_and_normalize *this,char *called)

{
  char *pcVar1;
  bool bVar2;
  PyObject **ppPVar3;
  PyObject **ppPVar4;
  PyObject **ppPVar5;
  string local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  allocator<char> local_219;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  undefined1 local_1f8 [8];
  string msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  char *local_170;
  char *exc_type_name_norm;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  allocator<char> local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  char *local_98;
  char *exc_type_name_orig;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  char *local_18;
  char *called_local;
  error_fetch_and_normalize *this_local;
  
  local_18 = called;
  called_local = (char *)this;
  object::object(&this->m_type);
  object::object(&this->m_value);
  object::object(&this->m_trace);
  std::__cxx11::string::string((string *)&this->m_lazy_error_string);
  this->m_lazy_error_string_completed = false;
  this->m_restore_called = false;
  ppPVar3 = handle::ptr((handle *)this);
  ppPVar4 = handle::ptr(&(this->m_value).super_handle);
  ppPVar5 = handle::ptr(&(this->m_trace).super_handle);
  PyErr_Fetch(ppPVar3,ppPVar4,ppPVar5);
  bVar2 = handle::operator_cast_to_bool((handle *)this);
  pcVar1 = local_18;
  if (!bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,pcVar1,(allocator<char> *)((long)&exc_type_name_orig + 7));
    std::operator+(&local_68,"Internal error: ",&local_88);
    std::operator+(&local_48,&local_68," called while Python error indicator not set.");
    pybind11_fail(&local_48);
  }
  ppPVar3 = handle::ptr((handle *)this);
  local_98 = obj_class_name(*ppPVar3);
  pcVar1 = local_18;
  if (local_98 == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,pcVar1,&local_f9);
    std::operator+(&local_d8,"Internal error: ",&local_f8);
    std::operator+(&local_b8,&local_d8,
                   " failed to obtain the name of the original active exception type.");
    pybind11_fail(&local_b8);
  }
  std::__cxx11::string::operator=((string *)&this->m_lazy_error_string,local_98);
  ppPVar3 = handle::ptr((handle *)this);
  ppPVar4 = handle::ptr(&(this->m_value).super_handle);
  ppPVar5 = handle::ptr(&(this->m_trace).super_handle);
  PyErr_NormalizeException(ppPVar3,ppPVar4,ppPVar5);
  ppPVar3 = handle::ptr((handle *)this);
  pcVar1 = local_18;
  if (*ppPVar3 == (PyObject *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_160,pcVar1,(allocator<char> *)((long)&exc_type_name_norm + 7));
    std::operator+(&local_140,"Internal error: ",&local_160);
    std::operator+(&local_120,&local_140," failed to normalize the active exception.");
    pybind11_fail(&local_120);
  }
  ppPVar3 = handle::ptr((handle *)this);
  local_170 = obj_class_name(*ppPVar3);
  pcVar1 = local_18;
  if (local_170 == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,pcVar1,(allocator<char> *)(msg.field_2._M_local_buf + 0xf));
    std::operator+(&local_1b0,"Internal error: ",&local_1d0);
    std::operator+(&local_190,&local_1b0,
                   " failed to obtain the name of the normalized active exception type.");
    pybind11_fail(&local_190);
  }
  bVar2 = std::operator!=(local_170,&this->m_lazy_error_string);
  pcVar1 = local_18;
  if (!bVar2) {
    return;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,pcVar1,&local_219);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                 &local_218,": MISMATCH of original and normalized active exception types: ");
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator(&local_219);
  std::__cxx11::string::operator+=((string *)local_1f8,"ORIGINAL ");
  std::__cxx11::string::operator+=((string *)local_1f8,(string *)&this->m_lazy_error_string);
  std::__cxx11::string::operator+=((string *)local_1f8," REPLACED BY ");
  std::__cxx11::string::operator+=((string *)local_1f8,local_170);
  format_value_and_trace_abi_cxx11_(&local_260,this);
  std::operator+(&local_240,": ",&local_260);
  std::__cxx11::string::operator+=((string *)local_1f8,(string *)&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_260);
  pybind11_fail((string *)local_1f8);
}

Assistant:

explicit error_fetch_and_normalize(const char *called) {
        PyErr_Fetch(&m_type.ptr(), &m_value.ptr(), &m_trace.ptr());
        if (!m_type) {
            pybind11_fail("Internal error: " + std::string(called)
                          + " called while "
                            "Python error indicator not set.");
        }
        const char *exc_type_name_orig = detail::obj_class_name(m_type.ptr());
        if (exc_type_name_orig == nullptr) {
            pybind11_fail("Internal error: " + std::string(called)
                          + " failed to obtain the name "
                            "of the original active exception type.");
        }
        m_lazy_error_string = exc_type_name_orig;
#if PY_VERSION_HEX >= 0x030C0000
        // The presence of __notes__ is likely due to exception normalization
        // errors, although that is not necessarily true, therefore insert a
        // hint only:
        if (PyObject_HasAttrString(m_value.ptr(), "__notes__")) {
            m_lazy_error_string += "[WITH __notes__]";
        }
#else
        // PyErr_NormalizeException() may change the exception type if there are cascading
        // failures. This can potentially be extremely confusing.
        PyErr_NormalizeException(&m_type.ptr(), &m_value.ptr(), &m_trace.ptr());
        if (m_type.ptr() == nullptr) {
            pybind11_fail("Internal error: " + std::string(called)
                          + " failed to normalize the "
                            "active exception.");
        }
        const char *exc_type_name_norm = detail::obj_class_name(m_type.ptr());
        if (exc_type_name_norm == nullptr) {
            pybind11_fail("Internal error: " + std::string(called)
                          + " failed to obtain the name "
                            "of the normalized active exception type.");
        }
#    if defined(PYPY_VERSION_NUM) && PYPY_VERSION_NUM < 0x07030a00
        // This behavior runs the risk of masking errors in the error handling, but avoids a
        // conflict with PyPy, which relies on the normalization here to change OSError to
        // FileNotFoundError (https://github.com/pybind/pybind11/issues/4075).
        m_lazy_error_string = exc_type_name_norm;
#    else
        if (exc_type_name_norm != m_lazy_error_string) {
            std::string msg = std::string(called)
                              + ": MISMATCH of original and normalized "
                                "active exception types: ";
            msg += "ORIGINAL ";
            msg += m_lazy_error_string;
            msg += " REPLACED BY ";
            msg += exc_type_name_norm;
            msg += ": " + format_value_and_trace();
            pybind11_fail(msg);
        }
#    endif
#endif
    }